

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O0

void __thiscall Qentem::StringStream<char>::allocate(StringStream<char> *this,SizeT size)

{
  SizeT size_00;
  char *new_storage;
  SizeT size_local;
  StringStream<char> *this_local;
  
  size_00 = Memory::AlignSize(size);
  new_storage = Memory::Allocate<char>(size_00);
  setStorage(this,new_storage);
  setCapacity(this,size_00);
  return;
}

Assistant:

void allocate(SizeT size) {
        size = Memory::AlignSize(size);

        setStorage(Memory::Allocate<Char_T>(size));

        setCapacity(size);
    }